

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_input_begin(nk_context *ctx)

{
  long in_RDI;
  nk_vec2 nVar1;
  nk_input *in;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      *(undefined4 *)(in_RDI + (long)local_c * 0x10 + 0x108) = 0;
    }
    *(undefined4 *)(in_RDI + 0x100) = 0;
    nVar1 = nk_vec2(0.0,0.0);
    *(nk_vec2 *)(in_RDI + 0x15c) = nVar1;
    *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)(in_RDI + 0x144);
    *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(in_RDI + 0x148);
    *(undefined4 *)(in_RDI + 0x154) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    for (local_c = 0; local_c < 0x1e; local_c = local_c + 1) {
      *(undefined4 *)(in_RDI + 4 + (long)local_c * 8) = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_input_begin(struct nk_context *ctx)
{
int i;
struct nk_input *in;
NK_ASSERT(ctx);
if (!ctx) return;
in = &ctx->input;
for (i = 0; i < NK_BUTTON_MAX; ++i)
in->mouse.buttons[i].clicked = 0;

in->keyboard.text_len = 0;
in->mouse.scroll_delta = nk_vec2(0,0);
in->mouse.prev.x = in->mouse.pos.x;
in->mouse.prev.y = in->mouse.pos.y;
in->mouse.delta.x = 0;
in->mouse.delta.y = 0;
for (i = 0; i < NK_KEY_MAX; i++)
in->keyboard.keys[i].clicked = 0;
}